

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O3

char * __thiscall crypto::xchacha20::crypt(xchacha20 *this,char *__key,char *__salt)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  char *in_RAX;
  long in_RCX;
  long lVar4;
  
  if (in_RCX != 0) {
    in_RAX = (char *)(ulong)this->pos;
    lVar4 = 0;
    do {
      bVar1 = (byte)in_RAX;
      if (bVar1 == 0x40) {
        update(this);
        this->pos = '\0';
        bVar1 = 0;
      }
      uVar3 = *(uint *)((long)this->keystream + (ulong)(bVar1 & 0xfc)) >> ((bVar1 & 3) << 3);
      __salt[lVar4] = (byte)uVar3 ^ __key[lVar4];
      lVar4 = lVar4 + 1;
      uVar2 = this->pos + '\x01';
      in_RAX = (char *)(ulong)CONCAT31((int3)(uVar3 >> 8),uVar2);
      this->pos = uVar2;
    } while (in_RCX != lVar4);
  }
  return in_RAX;
}

Assistant:

void xchacha20::crypt(const char * in, char * out, size_t length) {
	
	// asume pos > 0 && pos <= 64
	
	for(size_t i = 0; i < length; i++, pos++) {
		if(pos == sizeof(keystream)) {
			update();
			pos = 0;
		}
		boost::uint8_t key = boost::uint8_t(keystream[pos / sizeof(word)] >> ((pos % sizeof(word)) * 8));
		out[i] = char(boost::uint8_t(in[i]) ^ key);
	}
	
}